

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall wirehair::Codec::ResumeSolveMatrix(Codec *this,uint id,void *data)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint64_t *puVar4;
  uint8_t *puVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  void *in_RDX;
  uint32_t in_ESI;
  Codec *in_RDI;
  bool bVar16;
  uint next_heavy_col;
  bool nonzero;
  uint64_t word;
  uint64_t ge_mask_k;
  uint ge_column_k_1;
  uint64_t *other_row;
  uint8_t eliminator;
  uint start_column;
  uint8_t pivot_code;
  uint8_t *heavy_pivot_row;
  uint heavy_row_j;
  uint ge_row_j_1;
  uint8_t code_value;
  uint heavy_col_j_1;
  uint pivot_j_1;
  uint8_t bit_j;
  uint heavy_col_j;
  uint ge_column_j;
  uint8_t *heavy_row;
  uint heavy_row_i;
  uint16_t first_heavy_row_1;
  uint16_t column_count;
  uint64_t bit;
  uint ii_1;
  uint64_t row0;
  uint64_t *ge_pivot_row;
  uint ge_row_j;
  uint64_t *rem_row;
  uint word_offset;
  uint16_t pivot_j;
  uint64_t ge_mask;
  uint ge_column_k;
  uint ii;
  uint64_t *ge_src_row;
  uint row_k;
  PeelColumn *ref_col;
  uint16_t column;
  uint16_t ge_column_i;
  RowMixIterator mix;
  PeelRowIterator iter;
  uint64_t *ge_new_row;
  uint8_t *block_store_dest;
  PeelRow *row;
  uint16_t ge_row_k;
  uint pivot_i;
  uint16_t first_heavy_row;
  uint new_pivot_i;
  uint ge_row_i;
  uint row_i;
  uint i;
  uint16_t x;
  uint16_t distanceToP;
  uint16_t distanceToP_1;
  int in_stack_00000234;
  void *in_stack_00000238;
  uint8_t in_stack_00000247;
  void *in_stack_00000248;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar17;
  undefined8 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  uint local_150;
  uint local_144;
  uint local_124;
  ushort local_fa;
  ulong local_f8;
  uint local_ec;
  Codec *this_00;
  ushort local_c8 [4];
  ushort local_c0;
  ushort local_be;
  ushort local_bc;
  ushort local_ba;
  uint64_t *local_b8;
  uint8_t *local_b0;
  PeelRow *local_a8;
  ushort local_9e;
  uint local_9c;
  ushort local_96;
  uint local_94;
  uint local_90;
  uint local_8c;
  WirehairResult local_70;
  ushort local_6c;
  ushort local_6a;
  PeelRowParameters *local_68;
  ushort *local_60;
  ushort *local_58;
  ushort *local_50;
  char local_45;
  uint local_44;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  PeelRowParameters *local_38;
  ushort *local_30;
  byte local_22;
  byte local_21;
  ushort local_20;
  ushort local_1e;
  ushort local_1c;
  ushort local_1a;
  ushort *local_18;
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort *local_8;
  
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if (in_RDX == (void *)0x0) {
    local_70 = Wirehair_InvalidInput;
  }
  else {
    if ((uint)in_RDI->_row_count < (uint)in_RDI->_block_count + (uint)in_RDI->_extra_count) {
      local_94 = in_RDI->_pivot_count;
      in_RDI->_pivot_count = local_94 + 1;
      uVar6 = in_RDI->_row_count;
      in_RDI->_row_count = uVar6 + 1;
      local_8c = (uint)uVar6;
      local_90 = ((uint)in_RDI->_defer_count + (uint)in_RDI->_dense_count + local_8c) -
                 (uint)in_RDI->_block_count;
      in_RDI->_ge_row_map[local_90] = uVar6;
      in_RDI->_pivots[local_94] = (uint16_t)local_90;
    }
    else {
      local_96 = in_RDI->_defer_count + in_RDI->_dense_count;
      local_94 = 0;
      for (local_9c = in_RDI->_next_pivot; local_9c < in_RDI->_pivot_count; local_9c = local_9c + 1)
      {
        local_9e = in_RDI->_pivots[local_9c];
        if ((local_96 <= local_9e) && ((uint)local_9e < (uint)local_96 + (uint)in_RDI->_extra_count)
           ) {
          local_94 = local_9c & 0xffff;
          break;
        }
      }
      if (local_94 == 0) {
        return Wirehair_ExtraInsufficient;
      }
      local_90 = (uint)in_RDI->_pivots[local_94];
      local_8c = (uint)in_RDI->_ge_row_map[local_90];
    }
    local_a8 = in_RDI->_peel_rows + local_8c;
    local_a8->RecoveryId = in_ESI;
    local_b0 = in_RDI->_input_blocks + in_RDI->_block_bytes * local_8c;
    if (in_ESI == in_RDI->_block_count - 1) {
      memcpy(local_b0,in_RDX,(ulong)in_RDI->_output_final_bytes);
      memset(local_b0 + in_RDI->_output_final_bytes,0,
             (ulong)(in_RDI->_block_bytes - in_RDI->_output_final_bytes));
    }
    else {
      memcpy(local_b0,in_RDX,(ulong)in_RDI->_block_bytes);
    }
    local_b8 = in_RDI->_ge_matrix + in_RDI->_ge_pitch * local_90;
    memset(local_b8,0,(ulong)in_RDI->_ge_pitch << 3);
    PeelRowParameters::Initialize
              ((PeelRowParameters *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (uint32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (uint32_t)in_stack_fffffffffffffe70,(uint16_t)((uint)uVar17 >> 0x10),(uint16_t)uVar17
              );
    local_68 = &local_a8->Params;
    local_6a = in_RDI->_block_count;
    local_6c = in_RDI->_block_next_prime;
    local_60 = local_c8 + 3;
    local_c0 = (local_a8->Params).PeelFirst;
    local_c8[3] = local_68->PeelCount - 1;
    local_be = (local_a8->Params).PeelAdd;
    local_38 = &local_a8->Params;
    local_3a = in_RDI->_mix_count;
    local_3c = in_RDI->_mix_next_prime;
    local_30 = local_c8;
    uVar3 = (local_a8->Params).MixFirst;
    local_3e = uVar3;
    for (local_44 = 1; local_44 < 3; local_44 = local_44 + 1) {
      local_1e = (local_a8->Params).MixAdd;
      local_18 = &local_3e;
      local_3e = (ushort)((ulong)((uint)local_3e + (uint)local_1e) %
                         (ulong)(long)(int)(uint)local_3c);
      if (local_3a <= local_3e) {
        local_20 = local_3c - local_3e;
        if (local_1e < local_20) {
          local_3e = (ushort)(((uint)local_1e * 0x10000 - (uint)local_20) % (uint)local_1e);
        }
        else {
          local_3e = local_1e - local_20;
        }
      }
      local_30[local_44] = local_3e;
      local_1c = local_3c;
      local_1a = local_3a;
    }
    uVar6 = uVar3 + in_RDI->_defer_count;
    iVar15 = (int)(uint)uVar6 >> 6;
    local_b8[iVar15] = 1L << ((byte)uVar6 & 0x3f) ^ local_b8[iVar15];
    local_c8[1] = local_c8[1] + in_RDI->_defer_count;
    iVar15 = (int)(uint)local_c8[1] >> 6;
    local_b8[iVar15] = 1L << ((byte)local_c8[1] & 0x3f) ^ local_b8[iVar15];
    local_c8[2] = local_c8[2] + in_RDI->_defer_count;
    iVar15 = (int)(uint)local_c8[2] >> 6;
    local_b8[iVar15] = 1L << ((byte)local_c8[2] & 0x3f) ^ local_b8[iVar15];
    do {
      local_58 = local_c8 + 3;
      this_00 = (Codec *)(in_RDI->_peel_cols + local_c0);
      if ((uint8_t)this_00->_block_count == '\x01') {
        uVar6 = ((anon_union_2_3_10dc256e_for_PeelColumn_1 *)((long)&this_00->_block_bytes + 2))->
                Weight2Refs;
        puVar4 = in_RDI->_compress_matrix;
        uVar11 = in_RDI->_ge_pitch;
        for (local_ec = 0; local_ec < in_RDI->_ge_pitch; local_ec = local_ec + 1) {
          local_b8[local_ec] =
               puVar4[(ulong)(uVar11 * uVar6) + (ulong)local_ec] ^ local_b8[local_ec];
        }
      }
      else {
        uVar6 = ((anon_union_2_3_10dc256e_for_PeelColumn_1 *)((long)&this_00->_block_bytes + 2))->
                Weight2Refs;
        uVar7 = uVar6 >> 6;
        local_b8[uVar7] = 1L << ((byte)uVar6 & 0x3f) ^ local_b8[uVar7];
      }
      local_50 = local_c8 + 3;
      if (local_c8[3] == 0) {
        local_45 = '\0';
      }
      else {
        local_c8[3] = local_c8[3] + -1;
        local_8 = &local_c0;
        uVar6 = (ushort)((ulong)((uint)local_c0 + (uint)local_be) % (ulong)(long)(int)(uint)local_6c
                        );
        if (local_6a <= local_c0) {
          local_10 = local_6c - local_c0;
          if (local_be < local_10) {
            uVar6 = (ushort)(((uint)local_be * 0x10000 - (uint)local_10) % (uint)local_be);
          }
          else {
            uVar6 = local_be - local_10;
          }
        }
        local_c0 = uVar6;
        local_45 = '\x01';
        local_e = local_be;
        local_c = local_6c;
        local_a = local_6a;
      }
    } while (local_45 != '\0');
    local_f8 = 1;
    local_fa = 0;
    while( true ) {
      bVar16 = false;
      if ((uint)local_fa < in_RDI->_next_pivot) {
        bVar16 = (uint)local_fa < in_RDI->_first_heavy_column;
      }
      if (!bVar16) break;
      uVar11 = (int)(uint)local_fa >> 6;
      puVar12 = local_b8 + uVar11;
      if ((*puVar12 & local_f8) != 0) {
        uVar6 = in_RDI->_pivots[local_fa];
        puVar4 = in_RDI->_ge_matrix;
        uVar8 = in_RDI->_ge_pitch;
        *puVar12 = puVar4[(ulong)uVar11 + (ulong)(uVar8 * uVar6)] &
                   (local_f8 - 1 ^ 0xffffffffffffffff) ^ local_f8 ^ *puVar12;
        for (local_124 = 1; local_124 < in_RDI->_ge_pitch - uVar11; local_124 = local_124 + 1) {
          puVar12[local_124] =
               (puVar4 + (ulong)uVar11 + (ulong)(uVar8 * uVar6))[local_124] ^ puVar12[local_124];
        }
      }
      local_f8 = local_f8 << 1 | local_f8 >> 0x3f;
      local_fa = local_fa + 1;
    }
    local_bc = local_6a;
    local_ba = local_6c;
    if (in_RDI->_next_pivot < in_RDI->_first_heavy_column) {
      if ((local_b8[in_RDI->_next_pivot >> 6] & 1L << ((byte)in_RDI->_next_pivot & 0x3f)) == 0) {
        return Wirehair_NeedMore;
      }
      in_RDI->_pivots[local_94] = in_RDI->_pivots[in_RDI->_next_pivot];
      in_RDI->_pivots[in_RDI->_next_pivot] = (uint16_t)local_90;
    }
    else {
      uVar6 = in_RDI->_defer_count + in_RDI->_mix_count;
      uVar7 = in_RDI->_dense_count + in_RDI->_defer_count;
      puVar5 = in_RDI->_heavy_matrix;
      uVar11 = in_RDI->_heavy_pitch * (local_90 - uVar7);
      for (local_144 = in_RDI->_first_heavy_column; local_144 < uVar6; local_144 = local_144 + 1) {
        puVar5[(ulong)(local_144 - in_RDI->_first_heavy_column) + (ulong)uVar11] =
             (byte)(local_b8[local_144 >> 6] >> ((byte)local_144 & 0x3f)) & 1;
      }
      for (local_150 = in_RDI->_first_heavy_column; local_150 < in_RDI->_next_pivot;
          local_150 = local_150 + 1) {
        uVar8 = local_150 - in_RDI->_first_heavy_column;
        bVar1 = puVar5[(ulong)uVar8 + (ulong)uVar11];
        if (bVar1 != 0) {
          uVar9 = (uint)in_RDI->_pivots[local_150];
          if (uVar9 < uVar7) {
            puVar4 = in_RDI->_ge_matrix;
            uVar8 = in_RDI->_ge_pitch;
            uVar10 = local_150 + 1;
            uVar13 = 1L << ((byte)uVar10 & 0x3f);
            for (; uVar10 < uVar6; uVar10 = uVar10 + 1) {
              if ((puVar4[(ulong)(uVar8 * uVar9) + (ulong)(uVar10 >> 6)] & uVar13) != 0) {
                uVar14 = (ulong)(uVar10 - in_RDI->_first_heavy_column);
                puVar5[uVar14 + uVar11] = puVar5[uVar14 + uVar11] ^ bVar1;
              }
              uVar13 = uVar13 << 1 | uVar13 >> 0x3f;
            }
          }
          else {
            bVar2 = in_RDI->_heavy_matrix
                    [(ulong)uVar8 + (ulong)(in_RDI->_heavy_pitch * (uVar9 - uVar7))];
            if (bVar2 == 1) {
              gf256_muladd_mem(in_stack_00000248,in_stack_00000247,in_stack_00000238,
                               in_stack_00000234);
            }
            else {
              puVar5[(ulong)uVar8 + (ulong)uVar11] =
                   GF256Ctx.GF256_DIV_TABLE[(uint)bVar2 * 0x100 + (uint)bVar1];
              local_22 = bVar2;
              local_21 = bVar1;
              gf256_muladd_mem(in_stack_00000248,in_stack_00000247,in_stack_00000238,
                               in_stack_00000234);
            }
          }
        }
      }
      if (puVar5[(ulong)(in_RDI->_next_pivot - in_RDI->_first_heavy_column) + (ulong)uVar11] == '\0'
         ) {
        return Wirehair_NeedMore;
      }
      if (in_RDI->_next_pivot < in_RDI->_first_heavy_pivot) {
        in_RDI->_pivots[local_94] = in_RDI->_pivots[in_RDI->_first_heavy_pivot];
        in_RDI->_pivots[in_RDI->_first_heavy_pivot] = in_RDI->_pivots[in_RDI->_next_pivot];
        in_RDI->_first_heavy_pivot = in_RDI->_first_heavy_pivot + 1;
      }
      else {
        in_RDI->_pivots[local_94] = in_RDI->_pivots[in_RDI->_next_pivot];
      }
      in_RDI->_pivots[in_RDI->_next_pivot] = (uint16_t)local_90;
    }
    uVar11 = in_RDI->_next_pivot + 1;
    in_RDI->_next_pivot = uVar11;
    if (uVar11 == in_RDI->_first_heavy_column) {
      InsertHeavyRows(in_RDI);
    }
    bVar16 = Triangle(this_00);
    local_70 = (WirehairResult)!bVar16;
  }
  return local_70;
}

Assistant:

WirehairResult Codec::ResumeSolveMatrix(
    const unsigned id, ///< Block ID
    const void * GF256_RESTRICT data ///< Block data
)
{
    CAT_IF_DUMP(cout << endl << "---- ResumeSolveMatrix ----" << endl << endl;)

    if (!data) {
        return Wirehair_InvalidInput;
    }

    unsigned row_i, ge_row_i, new_pivot_i;

    // If there is no room for it:
    if (_row_count >= _block_count + _extra_count)
    {
        const uint16_t first_heavy_row = _defer_count + _dense_count;

        new_pivot_i = 0;

        // For each pivot in the list:
        for (unsigned pivot_i = _next_pivot; pivot_i < _pivot_count; ++pivot_i)
        {
            const uint16_t ge_row_k = _pivots[pivot_i];

            // If unused row is extra:
            if (ge_row_k >= first_heavy_row &&
                ge_row_k < (first_heavy_row + _extra_count))
            {
                // Re-use it
                new_pivot_i = (uint16_t)pivot_i;
                break;
            }
        }

        // If nothing was found, return error
        if (!new_pivot_i) {
            return Wirehair_ExtraInsufficient;
        }

        // Look up row indices
        ge_row_i = _pivots[new_pivot_i];
        row_i = _ge_row_map[ge_row_i];
    }
    else
    {
        // Add extra rows to the end of the pivot list
        new_pivot_i = _pivot_count++;
        row_i = _row_count++;
        ge_row_i = _defer_count + _dense_count + row_i - _block_count;
        _ge_row_map[ge_row_i] = (uint16_t)row_i;
        _pivots[new_pivot_i] = (uint16_t)ge_row_i;

        /*
            Before the extra rows are converted to heavy, the new rows
            are added to the end of the pivot list.  And after the extra
            rows are converted to heavy rows, new rows that come in are
            also heavy and should also be at the end of the pivot list.

            So, this doesn't need to change based on what stage of the
            GE solver is running through at this point.
        */
    }

    CAT_IF_DUMP(cout << "Resuming using row slot " << row_i << " and GE row " << ge_row_i << endl;)

    // Update row data needed at this point
    PeelRow * GF256_RESTRICT row = &_peel_rows[row_i];
    row->RecoveryId = id;

    uint8_t * GF256_RESTRICT block_store_dest = _input_blocks + _block_bytes * row_i;

    // Copy new block to input blocks
    if (id != (unsigned)_block_count - 1) {
        memcpy(block_store_dest, data, _block_bytes);
    }
    else
    {
        memcpy(block_store_dest, data, _output_final_bytes);

        memset(
            block_store_dest + _output_final_bytes,
            0,
            _block_bytes - _output_final_bytes);
    }

    // Generate new GE row
    uint64_t * GF256_RESTRICT ge_new_row = _ge_matrix + _ge_pitch * ge_row_i;

    // Clear the row initially before flipping bits on
    memset(ge_new_row, 0, _ge_pitch * sizeof(uint64_t));

    row->Params.Initialize(
        id,
        _p_seed,
        _block_count,
        _mix_count);

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);
    const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

    // Generate mixing bits in GE row
    uint16_t ge_column_i = mix.Columns[0] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[1] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[2] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);

    // Generate peeled bits in GE row
    do
    {
        const uint16_t column = iter.GetColumn();

        PeelColumn * GF256_RESTRICT ref_col = &_peel_cols[column];

        // If column is peeled:
        if (ref_col->Mark == MARK_PEEL)
        {
            const unsigned row_k = ref_col->PeelRow;
            const uint64_t * GF256_RESTRICT ge_src_row = _compress_matrix + _ge_pitch * row_k;

            // Add compress row to the new GE row
            for (unsigned ii = 0; ii < _ge_pitch; ++ii) {
                ge_new_row[ii] ^= ge_src_row[ii];
            }
        }
        else
        {
            const unsigned ge_column_k = ref_col->GEColumn;

            // Set bit for this deferred column
            ge_new_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        }
    } while (iter.Iterate());

    uint64_t ge_mask = 1;

    // For each pivot-found column up to the start of the heavy columns:
    for (uint16_t pivot_j = 0; pivot_j < _next_pivot && pivot_j < _first_heavy_column; ++pivot_j)
    {
        const unsigned word_offset = pivot_j >> 6;
        uint64_t * GF256_RESTRICT rem_row = &ge_new_row[word_offset];

        // If bit is set:
        if (0 != (*rem_row & ge_mask))
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            const uint64_t * GF256_RESTRICT ge_pivot_row = _ge_matrix + word_offset + _ge_pitch * ge_row_j;
            const uint64_t row0 = (*ge_pivot_row & ~(ge_mask - 1)) ^ ge_mask;

            // Unroll first word
            *rem_row ^= row0;

            // Add previous pivot row to new row
            CAT_DEBUG_ASSERT(_ge_pitch >= word_offset);
            for (unsigned ii = 1; ii < _ge_pitch - word_offset; ++ii) {
                rem_row[ii] ^= ge_pivot_row[ii];
            }
        }

        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    // If next pivot is not heavy:
    if (_next_pivot < _first_heavy_column)
    {
        const uint64_t bit = ge_new_row[_next_pivot >> 6] & ((uint64_t)1 << (_next_pivot & 63));

        // If the next pivot was not found on this row:
        if (0 == bit) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // Swap out the pivot index for this one
        _pivots[new_pivot_i] = _pivots[_next_pivot];
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }
    else
    {
        const uint16_t column_count = _defer_count + _mix_count;
        const uint16_t first_heavy_row = _dense_count + _defer_count;
        CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
        const unsigned heavy_row_i = ge_row_i - first_heavy_row;
        CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
        uint8_t * GF256_RESTRICT heavy_row = _heavy_matrix + _heavy_pitch * heavy_row_i;

        // For each heavy column:
        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            const unsigned heavy_col_j = ge_column_j - _first_heavy_column;
            const uint8_t bit_j = static_cast<uint8_t>((ge_new_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1);

            // Copy bit into column byte
            heavy_row[heavy_col_j] = bit_j;
        }

        // For each pivot-found column in the heavy columns:
        for (unsigned pivot_j = _first_heavy_column; pivot_j < _next_pivot; ++pivot_j)
        {
            CAT_DEBUG_ASSERT(pivot_j >= _first_heavy_column);
            const unsigned heavy_col_j = pivot_j - _first_heavy_column;
            CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
            const uint8_t code_value = heavy_row[heavy_col_j];

            // If column is zero:
            if (0 == code_value) {
                continue; // Skip it
            }

            const unsigned ge_row_j = _pivots[pivot_j];

            // If previous row is heavy:
            if (ge_row_j >= first_heavy_row)
            {
                // Calculate coefficient of elimination
                CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
                const unsigned heavy_row_j = ge_row_j - first_heavy_row;
                CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
                const uint8_t * GF256_RESTRICT heavy_pivot_row = _heavy_matrix + _heavy_pitch * heavy_row_j;
                CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
                const uint8_t pivot_code = heavy_pivot_row[heavy_col_j];
                const unsigned start_column = heavy_col_j + 1;

                // heavy[m+] += exist[m+] * (code_value / pivot_code)
                if (pivot_code == 1) {
                    // heavy[m+] += exist[m+] * code_value
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        code_value,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
                else
                {
                    // eliminator = code_value / pivot_code
                    const uint8_t eliminator = gf256_div(code_value, pivot_code);

                    // Store eliminator for later
                    heavy_row[heavy_col_j] = eliminator;

                    // heavy[m+] += exist[m+] * eliminator
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        eliminator,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
            }
            else
            {
                const uint64_t * GF256_RESTRICT other_row = _ge_matrix + _ge_pitch * ge_row_j;

                unsigned ge_column_k = pivot_j + 1;
                uint64_t ge_mask_k = (uint64_t)1 << (ge_column_k & 63);

                // For each remaining column:
                for (; ge_column_k < column_count; ++ge_column_k)
                {
                    const uint64_t word = other_row[ge_column_k >> 6];
                    const bool nonzero = 0 != (word & ge_mask_k);

                    // If bit is nonzero:
                    if (nonzero) {
                        // Add in the code value for this column
                        heavy_row[ge_column_k - _first_heavy_column] ^= code_value;
                    }

                    ge_mask_k = CAT_ROL64(ge_mask_k, 1);
                }
            } // end if row is heavy
        } // next column

        CAT_DEBUG_ASSERT(_next_pivot >= _first_heavy_column);
        const unsigned next_heavy_col = _next_pivot - _first_heavy_column;

        // If the next pivot was not found on this heavy row:
        if (!heavy_row[next_heavy_col]) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // If a non-heavy pivot just got moved into heavy pivot list:
        if (_next_pivot < _first_heavy_pivot)
        {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_first_heavy_pivot];
            _pivots[_first_heavy_pivot] = _pivots[_next_pivot];

            // And move the first heavy pivot up one to cover the hole
            ++_first_heavy_pivot;
        }
        else {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_next_pivot];
        }

        CAT_DEBUG_ASSERT(ge_row_i < _pivot_count);
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }

    // NOTE: Pivot was found and is definitely not set anywhere else
    // so it doesn't need to be cleared from any other GE rows.

    // If just starting heavy columns:
    if (++_next_pivot == _first_heavy_column) {
        InsertHeavyRows();
    }

    // Resume Triangle() at next pivot to determine
    return Triangle() ? Wirehair_Success : Wirehair_NeedMore;
}